

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS VerifyJsonNotString(_Bool IsJson5,char *Json)

{
  JlDataObject *pJVar1;
  JL_STATUS JVar2;
  JL_DATA_TYPE JVar3;
  JL_STATUS JVar4;
  WJTL_STATUS WVar5;
  size_t errorAtPos;
  JlDataObject *object;
  size_t local_40;
  JlDataObject *local_38;
  
  local_38 = (JlDataObject *)0x0;
  local_40 = 100;
  JVar2 = JlParseJsonEx(Json,IsJson5,&local_38,&local_40);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos )) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6a);
  pJVar1 = local_38;
  WjTestLib_Assert(local_38 != (JlDataObject *)0x0,"(object) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6b);
  JVar3 = JlGetObjectType(local_38);
  WjTestLib_Assert(JVar3 != JL_DATA_TYPE_STRING,"JlGetObjectType( object ) != JL_DATA_TYPE_STRING",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6c);
  JVar4 = JlFreeObjectTree(&local_38);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6d);
  WVar5 = WJTL_STATUS_SUCCESS;
  if (local_38 != (JlDataObject *)0x0) {
    WVar5 = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_STATUS_SUCCESS) {
    WVar5 = WJTL_STATUS_FAILED;
  }
  if (JVar3 == JL_DATA_TYPE_STRING) {
    WVar5 = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    WVar5 = WJTL_STATUS_FAILED;
  }
  if (JVar2 != JL_STATUS_SUCCESS) {
    WVar5 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(local_38 == (JlDataObject *)0x0,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6e);
  return WVar5;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonNotString
    (
        bool            IsJson5,
        char const*     Json
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_STATUS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ), JL_STATUS_SUCCESS );
    JL_ASSERT_NOT_NULL( object );
    JL_ASSERT( JlGetObjectType( object ) != JL_DATA_TYPE_STRING );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) )
    JL_ASSERT_NULL( object );

    return TestReturn;
}